

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

GPU_ErrorObject * GPU_PopErrorCode(void)

{
  GPU_ErrorObject *in_RDI;
  uint local_c;
  uint i;
  
  memset(in_RDI,0,0x18);
  gpu_init_error_queue();
  if (_gpu_num_error_codes != 0) {
    strcpy(_gpu_error_code_result.function,_gpu_error_code_queue->function);
    _gpu_error_code_result.error = _gpu_error_code_queue->error;
    strcpy(_gpu_error_code_result.details,_gpu_error_code_queue->details);
    in_RDI->function = _gpu_error_code_result.function;
    *(ulong *)&in_RDI->error = CONCAT44(_gpu_error_code_result._12_4_,_gpu_error_code_result.error);
    in_RDI->details = _gpu_error_code_result.details;
    _gpu_num_error_codes = _gpu_num_error_codes - 1;
    for (local_c = 0; local_c < _gpu_num_error_codes; local_c = local_c + 1) {
      strcpy(_gpu_error_code_queue[local_c].function,_gpu_error_code_queue[local_c + 1].function);
      _gpu_error_code_queue[local_c].error = _gpu_error_code_queue[local_c + 1].error;
      strcpy(_gpu_error_code_queue[local_c].details,_gpu_error_code_queue[local_c + 1].details);
    }
  }
  return in_RDI;
}

Assistant:

GPU_ErrorObject GPU_PopErrorCode(void)
{
    unsigned int i;
    GPU_ErrorObject result = {NULL, GPU_ERROR_NONE, NULL};

    gpu_init_error_queue();

    if(_gpu_num_error_codes <= 0)
        return result;

    // Pop the oldest
    strcpy(_gpu_error_code_result.function, _gpu_error_code_queue[0].function);
    _gpu_error_code_result.error = _gpu_error_code_queue[0].error;
    strcpy(_gpu_error_code_result.details, _gpu_error_code_queue[0].details);

    // We'll be returning that one
    result = _gpu_error_code_result;

    // Move the rest down
    _gpu_num_error_codes--;
    for(i = 0; i < _gpu_num_error_codes; i++)
    {
        strcpy(_gpu_error_code_queue[i].function, _gpu_error_code_queue[i+1].function);
        _gpu_error_code_queue[i].error = _gpu_error_code_queue[i+1].error;
        strcpy(_gpu_error_code_queue[i].details, _gpu_error_code_queue[i+1].details);
    }
    return result;
}